

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_reporter.c
# Opt level: O0

TestReporter * create_text_reporter(void)

{
  void *pvVar1;
  TestReporter *reporter;
  TextMemo *memo;
  TestReporter *local_8;
  
  local_8 = create_reporter();
  if (local_8 == (TestReporter *)0x0) {
    local_8 = (TestReporter *)0x0;
  }
  else {
    pvVar1 = malloc(0x18);
    if (pvVar1 == (void *)0x0) {
      destroy_reporter((TestReporter *)0x110822);
      local_8 = (TestReporter *)0x0;
    }
    else {
      local_8->memo = pvVar1;
      local_8->start_suite = text_reporter_start_suite;
      local_8->start_test = text_reporter_start_test;
      local_8->show_fail = show_fail;
      local_8->show_incomplete = show_incomplete;
      local_8->finish_test = text_reporter_finish;
      local_8->finish_suite = text_reporter_finish_suite;
      set_text_reporter_printer(local_8,printf);
      set_text_reporter_vprinter(local_8,vprintf);
    }
  }
  return local_8;
}

Assistant:

TestReporter *create_text_reporter(void) {
    TextMemo *memo;
    TestReporter *reporter = create_reporter();

    if (reporter == NULL) {
        return NULL;
    }

    memo = (TextMemo *)malloc(sizeof(TextMemo));
    if (memo == NULL) {
        destroy_reporter(reporter);
        return NULL;
    }
    reporter->memo = memo;

    reporter->start_suite = &text_reporter_start_suite;
    reporter->start_test = &text_reporter_start_test;
    reporter->show_fail = &show_fail;
    reporter->show_incomplete = &show_incomplete;
    reporter->finish_test = &text_reporter_finish;
    reporter->finish_suite = &text_reporter_finish_suite;

    set_text_reporter_printer(reporter, printf);
    set_text_reporter_vprinter(reporter, vprintf);

    return reporter;
}